

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrti.h
# Opt level: O3

uint32_t sqrti_5(uint32_t n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar5;
  uint uVar4;
  
  uVar1 = (uint)(0x3fffffff < n) << 0xf;
  uVar4 = 0x8000;
  do {
    uVar3 = uVar4 >> 1;
    uVar1 = uVar1 | uVar3;
    uVar2 = uVar3;
    if (uVar1 * uVar1 <= n) {
      uVar2 = 0;
    }
    uVar1 = uVar2 ^ uVar1;
    bVar5 = 3 < uVar4;
    uVar4 = uVar3;
  } while (bVar5);
  return uVar1;
}

Assistant:

uint32_t sqrti_5(uint32_t n)
{
    uint32_t c = 0x8000;
    uint32_t g = 0x8000;
    for (;;)
    {
        if (g * g > n)
        {
            g ^= c;
        }
        c >>= 1;
        if (c == 0)
        {
            return g;
        }
        g |= c;
    }
}